

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transreg.cpp
# Opt level: O2

void __thiscall
icu_63::TransliteratorSpec::TransliteratorSpec(TransliteratorSpec *this,UnicodeString *theSpec)

{
  UnicodeString *this_00;
  short sVar1;
  int32_t iVar2;
  int iVar3;
  CharString *pCVar4;
  char *src;
  ResourceBundle *this_01;
  Locale *result;
  UErrorCode status;
  UnicodeString *local_180;
  UnicodeString locStr;
  UScriptCode script [10];
  Locale topLoc;
  
  this_00 = &this->top;
  icu_63::UnicodeString::UnicodeString(this_00,theSpec);
  (this->spec).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00471e80;
  (this->spec).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->nextSpec).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00471e80;
  (this->nextSpec).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->scriptName).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00471e80;
  (this->scriptName).fUnion.fStackFields.fLengthAndFlags = 2;
  this->res = (ResourceBundle *)0x0;
  local_180 = &this->scriptName;
  status = U_ZERO_ERROR;
  Locale::Locale(&topLoc,"",(char *)0x0,(char *)0x0,(char *)0x0);
  result = &topLoc;
  LocaleUtility::initLocaleFromName(theSpec,result);
  if (topLoc.fIsBogus == '\0') {
    this_01 = (ResourceBundle *)UMemory::operator_new((UMemory *)0x18,(size_t)result);
    if (this_01 == (ResourceBundle *)0x0) {
      this->res = (ResourceBundle *)0x0;
      goto LAB_00273095;
    }
    ResourceBundle::ResourceBundle(this_01,"icudt63l-translit",&topLoc,&status);
    this->res = this_01;
    if (U_ZERO_ERROR < status || status == U_USING_DEFAULT_WARNING) {
      (*(this_01->super_UObject)._vptr_UObject[1])(this_01);
      this->res = (ResourceBundle *)0x0;
    }
  }
  status = U_ZERO_ERROR;
  script[2] = USCRIPT_COMMON;
  script[3] = USCRIPT_COMMON;
  script[8] = USCRIPT_COMMON;
  script[9] = USCRIPT_COMMON;
  script[4] = USCRIPT_COMMON;
  script[5] = USCRIPT_COMMON;
  script[6] = USCRIPT_COMMON;
  script[7] = USCRIPT_COMMON;
  script[0] = USCRIPT_INVALID_CODE;
  script[1] = USCRIPT_COMMON;
  MaybeStackArray<char,_40>::MaybeStackArray((MaybeStackArray<char,_40> *)&locStr);
  locStr.fUnion._48_4_ = 0;
  *(undefined1 *)locStr.super_Replaceable.super_UObject._vptr_UObject = 0;
  pCVar4 = CharString::appendInvariantChars((CharString *)&locStr,theSpec,&status);
  iVar2 = uscript_getCode_63((pCVar4->buffer).ptr,script,10,&status);
  MaybeStackArray<char,_40>::~MaybeStackArray((MaybeStackArray<char,_40> *)&locStr);
  if (script[0] != USCRIPT_INVALID_CODE && 0 < iVar2) {
    src = uscript_getName_63(script[0]);
    icu_63::UnicodeString::UnicodeString(&locStr,src,-1,kInvariant);
    icu_63::UnicodeString::moveFrom(local_180,&locStr);
    icu_63::UnicodeString::~UnicodeString(&locStr);
  }
  if (this->res == (ResourceBundle *)0x0) {
    sVar1 = (this->scriptName).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (this->scriptName).fUnion.fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    if (iVar3 != 0) {
      icu_63::UnicodeString::operator=(this_00,local_180);
    }
  }
  else {
    locStr.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00471e80;
    locStr.fUnion.fStackFields.fLengthAndFlags = 2;
    LocaleUtility::initNameFromLocale(&topLoc,&locStr);
    if ((locStr.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
      icu_63::UnicodeString::operator=(this_00,&locStr);
    }
    icu_63::UnicodeString::~UnicodeString(&locStr);
  }
  reset(this);
LAB_00273095:
  Locale::~Locale(&topLoc);
  return;
}

Assistant:

TransliteratorSpec::TransliteratorSpec(const UnicodeString& theSpec)
: top(theSpec),
  res(0)
{
    UErrorCode status = U_ZERO_ERROR;
    Locale topLoc("");
    LocaleUtility::initLocaleFromName(theSpec, topLoc);
    if (!topLoc.isBogus()) {
        res = new ResourceBundle(U_ICUDATA_TRANSLIT, topLoc, status);
        /* test for NULL */
        if (res == 0) {
            return;
        }
        if (U_FAILURE(status) || status == U_USING_DEFAULT_WARNING) {
            delete res;
            res = 0;
        }
    }

    // Canonicalize script name -or- do locale->script mapping
    status = U_ZERO_ERROR;
    static const int32_t capacity = 10;
    UScriptCode script[capacity]={USCRIPT_INVALID_CODE};
    int32_t num = uscript_getCode(CharString().appendInvariantChars(theSpec, status).data(),
                                  script, capacity, &status);
    if (num > 0 && script[0] != USCRIPT_INVALID_CODE) {
        scriptName = UnicodeString(uscript_getName(script[0]), -1, US_INV);
    }

    // Canonicalize top
    if (res != 0) {
        // Canonicalize locale name
        UnicodeString locStr;
        LocaleUtility::initNameFromLocale(topLoc, locStr);
        if (!locStr.isBogus()) {
            top = locStr;
        }
    } else if (scriptName.length() != 0) {
        // We are a script; use canonical name
        top = scriptName;
    }

    // assert(spec != top);
    reset();
}